

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void scroll_page_inter_command_start
               (Am_Object *command,bool vertical,Am_Object *ref_obj,int mousex,int mousey)

{
  Am_Object_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  long lVar4;
  long val_1;
  long val_2;
  long target_val_1;
  long target_val_2;
  Am_Wrapper *value;
  float fVar5;
  float val_1_00;
  float val_2_00;
  float target_val_1_00;
  float target_val_2_00;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Value local_c8;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object animator;
  int local_a0;
  int y;
  int x;
  int indicator_pos;
  Am_Object indicator;
  undefined1 local_88 [7];
  bool towards_val1;
  Am_Value val2;
  Am_Value val1;
  Am_Value cur_value;
  Am_Object scroll_command;
  Am_Object scrollbar;
  Am_Object inter;
  Am_Object local_30;
  int local_28;
  int local_24;
  int mousey_local;
  int mousex_local;
  Am_Object *ref_obj_local;
  Am_Object *pAStack_10;
  bool vertical_local;
  Am_Object *command_local;
  
  pAVar1 = save_pos_for_undo.Call;
  local_28 = mousey;
  local_24 = mousex;
  _mousey_local = ref_obj;
  ref_obj_local._7_1_ = vertical;
  pAStack_10 = command;
  Am_Object::Am_Object(&local_30,command);
  (*pAVar1)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Get_Owner(&scrollbar,(Am_Slot_Flags)command);
  bVar2 = Am_Object::Valid(&scrollbar);
  if (bVar2) {
    Am_Object::Get_Owner(&scroll_command,(Am_Slot_Flags)&scrollbar);
    bVar2 = Am_Object::Valid(&scroll_command);
    if (bVar2) {
      Am_Object::Am_Object((Am_Object *)&cur_value.value);
      pAVar3 = Am_Object::Get(&scroll_command,0xc5,0);
      Am_Object::operator=((Am_Object *)&cur_value.value,pAVar3);
      Am_Value::Am_Value((Am_Value *)&val1.value);
      Am_Value::Am_Value((Am_Value *)&val2.value);
      Am_Value::Am_Value((Am_Value *)local_88);
      pAVar3 = Am_Object::Peek(&scroll_command,0x181,0);
      Am_Value::operator=((Am_Value *)&val2.value,pAVar3);
      pAVar3 = Am_Object::Peek(&scroll_command,0x182,0);
      Am_Value::operator=((Am_Value *)local_88,pAVar3);
      pAVar3 = Am_Object::Peek(&scroll_command,0x169,0);
      Am_Value::operator=((Am_Value *)&val1.value,pAVar3);
      if ((val2.value.long_value._0_2_ == 2) && (local_88._0_2_ == 2)) {
        lVar4 = Am_Value::operator_cast_to_long((Am_Value *)&val1.value);
        val_1 = Am_Value::operator_cast_to_long((Am_Value *)&val2.value);
        val_2 = Am_Value::operator_cast_to_long((Am_Value *)local_88);
        target_val_1 = Am_Value::operator_cast_to_long((Am_Value *)&val2.value);
        target_val_2 = Am_Value::operator_cast_to_long((Am_Value *)local_88);
        lVar4 = Am_Clip_And_Map(lVar4,val_1,val_2,target_val_1,target_val_2);
        Am_Value::operator=((Am_Value *)&val1.value,lVar4);
      }
      else {
        fVar5 = Am_Value::operator_cast_to_float((Am_Value *)&val1.value);
        val_1_00 = Am_Value::operator_cast_to_float((Am_Value *)&val2.value);
        val_2_00 = Am_Value::operator_cast_to_float((Am_Value *)local_88);
        target_val_1_00 = Am_Value::operator_cast_to_float((Am_Value *)&val2.value);
        target_val_2_00 = Am_Value::operator_cast_to_float((Am_Value *)local_88);
        fVar5 = Am_Clip_And_Map(fVar5,val_1_00,val_2_00,target_val_1_00,target_val_2_00);
        Am_Value::operator=((Am_Value *)&val1.value,fVar5);
      }
      Am_Object::Set(&scroll_command,0x169,(Am_Value *)&val1.value,0);
      indicator.data._7_1_ = 0;
      Am_Object::Get_Object((Am_Object *)&x,(Am_Slot_Key)&scroll_command,0x1b7);
      bVar2 = Am_Translate_Coordinates
                        (ref_obj,local_24,local_28,&scroll_command,&local_a0,
                         (int *)((long)&animator.data + 4));
      if (bVar2) {
        if ((ref_obj_local._7_1_ & 1) == 0) {
          pAVar3 = Am_Object::Get((Am_Object *)&x,100,0);
          y = Am_Value::operator_cast_to_int(pAVar3);
          if (local_a0 < y) {
            indicator.data._7_1_ = 1;
          }
        }
        else {
          pAVar3 = Am_Object::Get((Am_Object *)&x,0x65,0);
          y = Am_Value::operator_cast_to_int(pAVar3);
          if (animator.data._4_4_ < y) {
            indicator.data._7_1_ = 1;
          }
        }
      }
      if ((indicator.data._7_1_ & 1) == 0) {
        Am_Value::operator=((Am_Value *)&val1.value,(Am_Value *)local_88);
      }
      else {
        Am_Value::operator=((Am_Value *)&val1.value,(Am_Value *)&val2.value);
      }
      Am_Object::Am_Object(&local_b8,&scroll_command);
      Am_Get_Animator(&local_b0,(Am_Slot_Key)&local_b8);
      Am_Object::~Am_Object(&local_b8);
      pAVar3 = Am_Object::Get(&scroll_command,0x184,0);
      Am_Object::Set(&local_b0,0x183,pAVar3,0);
      value = Am_Object::operator_cast_to_Am_Wrapper_(&scrollbar);
      Am_Object::Set(&local_b0,0x1ac,value,0);
      Am_Object::Set(&scroll_command,0x169,(Am_Value *)&val1.value,0x40000);
      Am_Value::Am_Value(&local_c8,(Am_Value *)&val1.value);
      Am_Object::Am_Object(&local_d0,&scroll_command);
      Am_Object::Am_Object(&local_d8,(Am_Object *)&cur_value.value);
      Am_Object::Am_Object(&local_e0,command);
      set_scrollbar_and_commands(&local_c8,&local_d0,&local_d8,&local_e0,false);
      Am_Object::~Am_Object(&local_e0);
      Am_Object::~Am_Object(&local_d8);
      Am_Object::~Am_Object(&local_d0);
      Am_Value::~Am_Value(&local_c8);
      Am_Object::~Am_Object(&local_b0);
      Am_Object::~Am_Object((Am_Object *)&x);
      Am_Value::~Am_Value((Am_Value *)local_88);
      Am_Value::~Am_Value((Am_Value *)&val2.value);
      Am_Value::~Am_Value((Am_Value *)&val1.value);
      Am_Object::~Am_Object((Am_Object *)&cur_value.value);
    }
    Am_Object::~Am_Object(&scroll_command);
  }
  Am_Object::~Am_Object(&scrollbar);
  return;
}

Assistant:

void
scroll_page_inter_command_start(Am_Object command, bool vertical,
                                Am_Object ref_obj, int mousex, int mousey)
{
  save_pos_for_undo.Call(command);

  Am_Object inter = command.Get_Owner();
  if (inter.Valid()) {
    Am_Object scrollbar = inter.Get_Owner();
    if (scrollbar.Valid()) {
      Am_Object scroll_command;
      scroll_command = scrollbar.Get(Am_COMMAND);

      Am_Value cur_value, val1, val2;
      val1 = scrollbar.Peek(Am_VALUE_1);
      val2 = scrollbar.Peek(Am_VALUE_2);
      cur_value = scrollbar.Peek(Am_VALUE);

      // clip cur_value inside val1 and val2
      if (val1.type == Am_INT && val2.type == Am_INT) {
        cur_value = Am_Clip_And_Map((long)cur_value, (long)val1, (long)val2,
                                    (long)val1, (long)val2);
      } else { // calc in float
        cur_value = Am_Clip_And_Map((float)cur_value, (float)val1, (float)val2,
                                    (float)val1, (float)val2);
      }
      scrollbar.Set(Am_VALUE, cur_value);

      // choose the appropriate target value,
      // based on whether click is above the indicator
      bool towards_val1 = false;
      Am_Object indicator = scrollbar.Get_Object(Am_SCROLL_INDICATOR);
      int indicator_pos, x, y;
      if (Am_Translate_Coordinates(ref_obj, mousex, mousey, scrollbar, x, y)) {
        if (vertical) {
          indicator_pos = indicator.Get(Am_TOP);
          if (indicator_pos > y)
            towards_val1 = true;
        } else { //horizontal
          indicator_pos = indicator.Get(Am_LEFT);
          if (indicator_pos > x)
            towards_val1 = true;
        }
      }
      if (towards_val1)
        cur_value = val1;
      else
        cur_value = val2;

      // set up the animation
      Am_Object animator = Am_Get_Animator(scrollbar, Am_VALUE);
      animator.Set(Am_SMALL_INCREMENT, scrollbar.Get(Am_LARGE_INCREMENT));
      animator.Set(Am_INTERACTOR, inter);

      // trigger the animation
      scrollbar.Set(Am_VALUE, cur_value, Am_WITH_ANIMATION);
      set_scrollbar_and_commands(cur_value, scrollbar, scroll_command, command,
                                 false);
    }
  }
}